

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasLazyFields
               (Descriptor *descriptor,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  Descriptor *descriptor_00;
  int local_34;
  int local_30;
  int idx_1;
  int idx;
  int field_idx;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  Descriptor *descriptor_local;
  
  idx_1 = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= idx_1) {
      local_30 = 0;
      while( true ) {
        iVar2 = Descriptor::extension_count(descriptor);
        if (iVar2 <= local_30) {
          local_34 = 0;
          while( true ) {
            iVar2 = Descriptor::nested_type_count(descriptor);
            if (iVar2 <= local_34) {
              return false;
            }
            descriptor_00 = Descriptor::nested_type(descriptor,local_34);
            bVar1 = HasLazyFields(descriptor_00,options,scc_analyzer);
            if (bVar1) break;
            local_34 = local_34 + 1;
          }
          return true;
        }
        pFVar3 = Descriptor::extension(descriptor,local_30);
        bVar1 = IsLazy(pFVar3,options,scc_analyzer);
        if (bVar1) break;
        local_30 = local_30 + 1;
      }
      return true;
    }
    pFVar3 = Descriptor::field(descriptor,idx_1);
    bVar1 = IsLazy(pFVar3,options,scc_analyzer);
    if (bVar1) break;
    idx_1 = idx_1 + 1;
  }
  return true;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor, const Options& options,
                          MessageSCCAnalyzer* scc_analyzer) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}